

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::ProcessCacheArg(cmake *this,string *var,string *value,CacheEntryType type)

{
  pointer pcVar1;
  string *psVar2;
  bool local_b9;
  cmValue local_90;
  allocator<char> local_81;
  string local_80;
  cmValue local_50;
  cmValue v;
  string cachedValue;
  bool haveValue;
  CacheEntryType type_local;
  string *value_local;
  string *var_local;
  cmake *this_local;
  
  cachedValue.field_2._M_local_buf[0xb] = '\0';
  std::__cxx11::string::string((string *)&v);
  if ((this->WarnUnusedCli & 1U) != 0) {
    pcVar1 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    local_50 = cmState::GetInitializedCacheValue(pcVar1,var);
    cachedValue.field_2._M_local_buf[0xb] = cmValue::operator_cast_to_bool(&local_50);
    if ((bool)cachedValue.field_2._M_local_buf[0xb]) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_50);
      std::__cxx11::string::operator=((string *)&v,(string *)psVar2);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"No help, variable specified on the command line.",&local_81);
  AddCacheEntry(this,var,value,&local_80,type);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((this->WarnUnusedCli & 1U) != 0) {
    local_b9 = true;
    if (cachedValue.field_2._M_local_buf[0xb] != '\0') {
      pcVar1 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      local_90 = cmState::GetInitializedCacheValue(pcVar1,var);
      psVar2 = cmValue::operator*[abi_cxx11_(&local_90);
      local_b9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&v,psVar2);
    }
    if (local_b9 != false) {
      WatchUnusedCli(this,var);
    }
  }
  std::__cxx11::string::~string((string *)&v);
  return;
}

Assistant:

void cmake::ProcessCacheArg(const std::string& var, const std::string& value,
                            cmStateEnums::CacheEntryType type)
{
  // The value is transformed if it is a filepath for example, so
  // we can't compare whether the value is already in the cache until
  // after we call AddCacheEntry.
  bool haveValue = false;
  std::string cachedValue;
  if (this->WarnUnusedCli) {
    if (cmValue v = this->State->GetInitializedCacheValue(var)) {
      haveValue = true;
      cachedValue = *v;
    }
  }

  this->AddCacheEntry(
    var, value, "No help, variable specified on the command line.", type);

  if (this->WarnUnusedCli) {
    if (!haveValue ||
        cachedValue != *this->State->GetInitializedCacheValue(var)) {
      this->WatchUnusedCli(var);
    }
  }
}